

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O0

lys_module * yin_read_module(ly_ctx *ctx,char *data,char *revision,int implement)

{
  lyxml_elem *yin_00;
  LY_ERR *pLVar1;
  lys_module *result;
  lyxml_elem *yin;
  int implement_local;
  char *revision_local;
  char *data_local;
  ly_ctx *ctx_local;
  
  yin_00 = lyxml_parse_mem(ctx,data,2);
  if (yin_00 == (lyxml_elem *)0x0) {
    pLVar1 = ly_errno_glob_address();
    ly_log(ctx,LY_LLERR,*pLVar1,"Module parsing failed.");
    ctx_local = (ly_ctx *)0x0;
  }
  else {
    ctx_local = (ly_ctx *)yin_read_module_(ctx,yin_00,revision,implement);
    lyxml_free(ctx,yin_00);
  }
  return (lys_module *)ctx_local;
}

Assistant:

struct lys_module *
yin_read_module(struct ly_ctx *ctx, const char *data, const char *revision, int implement)
{
    struct lyxml_elem *yin;
    struct lys_module *result;

    yin = lyxml_parse_mem(ctx, data, LYXML_PARSE_NOMIXEDCONTENT);
    if (!yin) {
        LOGERR(ctx, ly_errno, "Module parsing failed.");
        return NULL;
    }

    result = yin_read_module_(ctx, yin, revision, implement);

    lyxml_free(ctx, yin);

    return result;
}